

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

int32_t icu_63::MessagePattern::parseArgNumber(UnicodeString *s,int32_t start,int32_t limit)

{
  bool bVar1;
  char16_t cVar2;
  int offset;
  int iVar3;
  int32_t iVar4;
  
  if (start < limit) {
    offset = start + 1;
    cVar2 = UnicodeString::doCharAt(s,start);
    if (cVar2 == L'0') {
      bVar1 = true;
      iVar3 = 0;
      if (offset == limit) {
        return 0;
      }
    }
    else {
      if (8 < (ushort)(cVar2 + L'ￏ')) {
        return -1;
      }
      iVar3 = (ushort)cVar2 - 0x30;
      bVar1 = false;
    }
    while (offset < limit) {
      cVar2 = UnicodeString::doCharAt(s,offset);
      if (9 < (ushort)(cVar2 + L'￐')) {
        return -1;
      }
      offset = offset + 1;
      if (0xccccccb < iVar3) {
        bVar1 = true;
      }
      iVar3 = iVar3 * 10 + (uint)(ushort)cVar2 + -0x30;
    }
    iVar4 = -2;
    if (!bVar1) {
      iVar4 = iVar3;
    }
  }
  else {
    iVar4 = -2;
  }
  return iVar4;
}

Assistant:

int32_t
MessagePattern::parseArgNumber(const UnicodeString &s, int32_t start, int32_t limit) {
    // If the identifier contains only ASCII digits, then it is an argument _number_
    // and must not have leading zeros (except "0" itself).
    // Otherwise it is an argument _name_.
    if(start>=limit) {
        return UMSGPAT_ARG_NAME_NOT_VALID;
    }
    int32_t number;
    // Defer numeric errors until we know there are only digits.
    UBool badNumber;
    UChar c=s.charAt(start++);
    if(c==0x30) {
        if(start==limit) {
            return 0;
        } else {
            number=0;
            badNumber=TRUE;  // leading zero
        }
    } else if(0x31<=c && c<=0x39) {
        number=c-0x30;
        badNumber=FALSE;
    } else {
        return UMSGPAT_ARG_NAME_NOT_NUMBER;
    }
    while(start<limit) {
        c=s.charAt(start++);
        if(0x30<=c && c<=0x39) {
            if(number>=INT32_MAX/10) {
                badNumber=TRUE;  // overflow
            }
            number=number*10+(c-0x30);
        } else {
            return UMSGPAT_ARG_NAME_NOT_NUMBER;
        }
    }
    // There are only ASCII digits.
    if(badNumber) {
        return UMSGPAT_ARG_NAME_NOT_VALID;
    } else {
        return number;
    }
}